

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

char __thiscall Application::queryAction(Application *this)

{
  ostream *poVar1;
  exception *this_00;
  char local_11;
  Application *pAStack_10;
  char value;
  Application *this_local;
  
  pAStack_10 = this;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"1) Enter Order");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"2) Cancel Order");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"3) Replace Order");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"4) Market data test");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"5) Quit");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"Action: ");
  std::operator>>((istream *)&std::cin,&local_11);
  if ((int)local_11 - 0x31U < 5) {
    return local_11;
  }
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

char Application::queryAction() {
  char value;
  std::cout << std::endl
            << "1) Enter Order" << std::endl
            << "2) Cancel Order" << std::endl
            << "3) Replace Order" << std::endl
            << "4) Market data test" << std::endl
            << "5) Quit" << std::endl
            << "Action: ";
  std::cin >> value;
  switch (value) {
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
    break;
  default:
    throw std::exception();
  }
  return value;
}